

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::~MessageGenerator(MessageGenerator *this)

{
  MessageGenerator *this_local;
  
  std::
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
  ::~vector(&this->oneof_generators_);
  std::
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
  ::~vector(&this->nested_message_generators_);
  std::
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::EnumGenerator,_std::default_delete<google::protobuf::compiler::objectivec::EnumGenerator>_>_>_>
  ::~vector(&this->enum_generators_);
  std::
  vector<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
  ::~vector(&this->extension_generators_);
  std::__cxx11::string::~string((string *)&this->deprecated_attribute_);
  std::__cxx11::string::~string((string *)&this->class_name_);
  FieldGeneratorMap::~FieldGeneratorMap(&this->field_generators_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

MessageGenerator::~MessageGenerator() {}